

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdServer.hpp
# Opt level: O1

void __thiscall Statsd::StatsdServer::StatsdServer(StatsdServer *this,unsigned_short port)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  long *plVar6;
  uint uVar7;
  long *plVar8;
  ulong uVar9;
  uint uVar10;
  sockaddr_in address;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  sockaddr local_48;
  
  (this->m_errorMessage)._M_dataplus._M_p = (pointer)&(this->m_errorMessage).field_2;
  (this->m_errorMessage)._M_string_length = 0;
  (this->m_errorMessage).field_2._M_local_buf[0] = '\0';
  iVar4 = socket(2,2,0x11);
  this->m_socket = iVar4;
  if (iVar4 == -1) {
    puVar5 = (uint *)__errno_location();
    uVar1 = *puVar5;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    uVar10 = 1;
    if (9 < uVar2) {
      uVar9 = (ulong)uVar2;
      uVar3 = 4;
      do {
        uVar10 = uVar3;
        uVar7 = (uint)uVar9;
        if (uVar7 < 100) {
          uVar10 = uVar10 - 2;
          goto LAB_00105790;
        }
        if (uVar7 < 1000) {
          uVar10 = uVar10 - 1;
          goto LAB_00105790;
        }
        if (uVar7 < 10000) goto LAB_00105790;
        uVar9 = uVar9 / 10000;
        uVar3 = uVar10 + 4;
      } while (99999 < uVar7);
      uVar10 = uVar10 + 1;
    }
LAB_00105790:
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct((ulong)local_88,(char)uVar10 - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>(local_88[0] + (uVar1 >> 0x1f),uVar10,uVar2);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,0x10a368);
  }
  else {
    local_48.sa_data[6] = '\0';
    local_48.sa_data[7] = '\0';
    local_48.sa_data[8] = '\0';
    local_48.sa_data[9] = '\0';
    local_48.sa_data[10] = '\0';
    local_48.sa_data[0xb] = '\0';
    local_48.sa_data[0xc] = '\0';
    local_48.sa_data[0xd] = '\0';
    local_48.sa_data._0_2_ = port << 8 | port >> 8;
    local_48.sa_family = 2;
    local_48.sa_data._2_4_ = 0;
    iVar4 = bind(iVar4,&local_48,0x10);
    if (iVar4 == 0) {
      return;
    }
    close(this->m_socket);
    this->m_socket = -1;
    puVar5 = (uint *)__errno_location();
    uVar1 = *puVar5;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    uVar10 = 1;
    if (9 < uVar2) {
      uVar9 = (ulong)uVar2;
      uVar3 = 4;
      do {
        uVar10 = uVar3;
        uVar7 = (uint)uVar9;
        if (uVar7 < 100) {
          uVar10 = uVar10 - 2;
          goto LAB_0010573a;
        }
        if (uVar7 < 1000) {
          uVar10 = uVar10 - 1;
          goto LAB_0010573a;
        }
        if (uVar7 < 10000) goto LAB_0010573a;
        uVar9 = uVar9 / 10000;
        uVar3 = uVar10 + 4;
      } while (99999 < uVar7);
      uVar10 = uVar10 + 1;
    }
LAB_0010573a:
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct((ulong)local_88,(char)uVar10 - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>(local_88[0] + (uVar1 >> 0x1f),uVar10,uVar2);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,0x10a3d2);
  }
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_58 = *plVar8;
    lStack_50 = plVar6[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar8;
    local_68 = (long *)*plVar6;
  }
  local_60 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->m_errorMessage,(string *)&local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  return;
}

Assistant:

StatsdServer(unsigned short port = 8125) noexcept {
#ifdef _WIN32
        if (!detail::WinSockSingleton::getInstance().ok()) {
            m_errorMessage = "WSAStartup failed: errno=" + std::to_string(SOCKET_ERRNO);
        }
#endif

        // Create the socket
        m_socket = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
        if (!detail::isValidSocket(m_socket)) {
            m_errorMessage = "socket creation failed: errno=" + std::to_string(SOCKET_ERRNO);
            return;
        }

        // Binding should be with ipv4 to all interfaces
        struct sockaddr_in address {};
        address.sin_family = AF_INET;
        address.sin_port = htons(port);
        address.sin_addr.s_addr = INADDR_ANY;

        // Try to bind
        if (bind(m_socket, reinterpret_cast<const struct sockaddr*>(&address), sizeof(address)) != 0) {
            SOCKET_CLOSE(m_socket);
            m_socket = k_invalidSocket;
            m_errorMessage = "bind failed: errno=" + std::to_string(SOCKET_ERRNO);
        }
    }